

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_MapEntryMissingEmptyFieldIsOkTest_Test::
~ComparisonTest_MapEntryMissingEmptyFieldIsOkTest_Test
          (ComparisonTest_MapEntryMissingEmptyFieldIsOkTest_Test *this)

{
  ComparisonTest_MapEntryMissingEmptyFieldIsOkTest_Test *this_local;
  
  ~ComparisonTest_MapEntryMissingEmptyFieldIsOkTest_Test(this);
  operator_delete(this,0x1118);
  return;
}

Assistant:

TEST_F(ComparisonTest, MapEntryMissingEmptyFieldIsOkTest) {
  TextFormat::Parser parser;
  proto2_unittest::TestMap msg1;
  proto2_unittest::TestMap msg2;

  ASSERT_TRUE(parser.ParseFromString(
      "map_string_foreign_message { key: 'key1' value {}}", &msg1));
  ASSERT_TRUE(parser.ParseFromString(
      "map_string_foreign_message { key: 'key1' }", &msg2));

  util::MessageDifferencer differencer;
  differencer.set_scope(util::MessageDifferencer::PARTIAL);

  ASSERT_TRUE(differencer.Compare(msg1, msg2));
}